

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chr_time.c
# Opt level: O0

void chr_timer_sum(chr_time *sum,chr_time *src1,chr_time *src2)

{
  timeval *s2;
  timeval *s1;
  timeval s;
  chr_time *src2_local;
  chr_time *src1_local;
  chr_time *sum_local;
  
  s.tv_sec = (long)src1->d1 + (long)src2->d1;
  s.tv_usec = (long)src1->d2 + (long)src2->d2;
  if (1000000 < s.tv_usec) {
    s.tv_usec = s.tv_usec + -1000000;
    s.tv_sec = s.tv_sec + 1;
  }
  sum->d1 = (double)s.tv_sec;
  sum->d2 = (double)s.tv_usec;
  return;
}

Assistant:

extern void
chr_timer_sum( chr_time *sum, chr_time *src1, chr_time *src2)
{
    struct timeval s;
    struct timeval *s1 = (struct timeval *)src1;
    struct timeval *s2 = (struct timeval *)src2;
    s.tv_sec = s1->tv_sec + s2->tv_sec;
    s.tv_usec = s1->tv_usec + s2->tv_usec;
    if (s.tv_usec > 1000000) {
	s.tv_usec -= 1000000;
	s.tv_sec++;
    }
    *((struct timeval*)sum) = s;
}